

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canvas_hitbox(_glist *x,t_gobj *y,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  int iVar1;
  int iVar2;
  int y2;
  int x2;
  int y1;
  int x1;
  int local_54;
  int *local_50;
  int *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_48 = x1p;
  iVar1 = gobj_shouldvis(y,x);
  iVar2 = 0;
  if (iVar1 != 0) {
    local_50 = y1p;
    gobj_getrect(y,x,&local_34,&local_38,&local_3c,&local_54);
    iVar2 = 0;
    if ((ypos <= local_54 && xpos <= local_3c) && (local_38 <= ypos && local_34 <= xpos)) {
      *local_48 = local_34;
      *local_50 = local_38;
      *x2p = local_3c;
      *y2p = local_54;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int canvas_hitbox(t_canvas *x, t_gobj *y, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    int x1, y1, x2, y2;
    if (!gobj_shouldvis(y, x))
        return (0);
    gobj_getrect(y, x, &x1, &y1, &x2, &y2);
    if (xpos >= x1 && xpos <= x2 && ypos >= y1 && ypos <= y2)
    {
        *x1p = x1;
        *y1p = y1;
        *x2p = x2;
        *y2p = y2;
        return (1);
    }
    else return (0);
}